

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

void __thiscall CVmObjLookupTable::load_image_data(CVmObjLookupTable *this,char *ptr,size_t siz)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar6;
  long lVar7;
  uint *puVar8;
  long lVar9;
  vm_val_t *val;
  char *buf;
  int local_38;
  uint *puVar5;
  
  if ((this->super_CVmObjCollection).super_CVmObject.ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  uVar2 = *(ushort *)ptr;
  uVar3 = *(ushort *)(ptr + 2);
  iVar4 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])
                    (G_mem_X->varheap_,(ulong)(uVar2 - 1) * 8 + 0x28 + (ulong)uVar3 * 0x28,this);
  puVar5 = (uint *)CONCAT44(extraout_var,iVar4);
  *puVar5 = (uint)uVar2;
  puVar5[1] = (uint)uVar3;
  puVar5[4] = 1;
  (this->super_CVmObjCollection).super_CVmObject.ext_ = (char *)puVar5;
  uVar6 = (ulong)*puVar5;
  puVar8 = (uint *)0x0;
  if (*(ushort *)(ptr + 4) != 0) {
    puVar8 = puVar5 + uVar6 * 2 + (ulong)(*(ushort *)(ptr + 4) - 1) * 10 + 8;
  }
  buf = ptr + 6;
  *(uint **)(puVar5 + 2) = puVar8;
  if (uVar2 != 0) {
    lVar7 = 0;
    do {
      puVar8 = (uint *)0x0;
      if (*(ushort *)(buf + lVar7) != 0) {
        puVar8 = puVar5 + (ulong)*puVar5 * 2 + (ulong)(*(ushort *)(buf + lVar7) - 1) * 10 + 8;
      }
      *(uint **)(puVar5 + lVar7 + 8) = puVar8;
      lVar7 = lVar7 + 2;
    } while ((uint)uVar2 * 2 != (int)lVar7);
    uVar6 = (ulong)*puVar5;
    buf = buf + lVar7;
  }
  val = (vm_val_t *)(puVar5 + 4);
  if ((ulong)uVar3 != 0) {
    lVar7 = uVar6 * 8 + 0x20;
    local_38 = (uint)uVar3 * 0x28;
    lVar9 = 0;
    do {
      piVar1 = (int *)((long)puVar5 + lVar9 + lVar7);
      *piVar1 = (int)*buf;
      vmb_get_dh_val(buf,(vm_val_t *)((long)puVar5 + lVar9 + lVar7));
      ((vm_val_t *)(piVar1 + 4))->typ = (int)buf[5];
      vmb_get_dh_val(buf + 5,(vm_val_t *)(piVar1 + 4));
      puVar8 = (uint *)0x0;
      if (*(ushort *)(buf + 10) != 0) {
        puVar8 = puVar5 + (ulong)*puVar5 * 2 + (ulong)(*(ushort *)(buf + 10) - 1) * 10 + 8;
      }
      *(uint **)(piVar1 + 8) = puVar8;
      buf = buf + 0xc;
      lVar9 = lVar9 + 0x28;
    } while (local_38 != (int)lVar9);
  }
  val->typ = VM_NIL;
  if (buf + 5 <= ptr + siz) {
    val->typ = (int)*buf;
    vmb_get_dh_val(buf,val);
    return;
  }
  return;
}

Assistant:

void CVmObjLookupTable::load_image_data(VMG_ const char *ptr, size_t siz)
{
    uint bucket_cnt;
    uint val_cnt;
    uint i;
    const char *ibp;
    vm_lookup_val **ebp;
    vm_lookup_val *eval;
    vm_lookup_ext *ext;

    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the bucket and value counts from the header */
    bucket_cnt = osrp2(ptr);
    val_cnt = osrp2(ptr + 2);

    /* allocate space for a copy of the image data */
    ext = vm_lookup_ext::alloc_ext(vmg_ this, bucket_cnt, val_cnt);
    ext_ = (char *)ext;

    /* initialize the free list pointer, given as a 1-based entry index */
    ext->first_free = ext->img_idx_to_val(osrp2(ptr + 4));

    /* initialize the table from the load image data */
    for (i = bucket_cnt, ibp = ptr + 6, ebp = ext->buckets ;
         i != 0 ; --i, ibp += 2, ++ebp)
    {
        /* translate the image file index to a value pointer */
        *ebp = ext->img_idx_to_val(osrp2(ibp));
    }

    /* initialize the value entries */
    for (i = val_cnt, eval = ext->idx_to_val(0) ;
         i != 0 ; --i, ibp += VMLOOKUP_VALUE_SIZE, ++eval)
    {
        /* read the key and value */
        vmb_get_dh(ibp, &eval->key);
        vmb_get_dh(ibp + VMB_DATAHOLDER, &eval->val);

        /* remember the next pointer, which is given as a 1-based index */
        eval->nxt = ext->img_idx_to_val(osrp2(ibp + VMB_DATAHOLDER*2));
    }

    /* if a default value is included, read it */
    ext->default_value.set_nil();
    if (ibp + VMB_DATAHOLDER <= ptr + siz)
    {
        /* read the default value and skip it in the source data */
        vmb_get_dh(ibp, &ext->default_value);
        ibp += VMB_DATAHOLDER;
    }
}